

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

void __thiscall Node::Node(Node *this,Node *node)

{
  pointer pNVar1;
  Node *item;
  pointer __x;
  
  this->_if = false;
  this->_else = false;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  (this->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->kind = node->kind;
  std::__cxx11::string::_M_assign((string *)&this->value);
  pNVar1 = (node->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (node->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pNVar1; __x = __x + 1) {
    std::vector<Node,_std::allocator<Node>_>::push_back(&this->subnodes,__x);
  }
  return;
}

Assistant:

Node::Node(const Node &node) {
    kind = node.kind;
    value = node.value;
    for (auto &item : node.subnodes) {
        subnodes.push_back(item);
    }
}